

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

int traverseephemeron(global_State *g,Table *h,int inv)

{
  Node *pNVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  GCObject *o;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  int local_3c;
  
  uVar9 = 1L << (h->lsizenode & 0x3f);
  local_3c = traversearray(g,h);
  uVar8 = (uint)uVar9;
  bVar3 = false;
  bVar4 = false;
  for (uVar7 = 0; uVar8 = uVar8 - 1, uVar7 != uVar9; uVar7 = uVar7 + 1) {
    uVar6 = (ulong)uVar8;
    if (inv == 0) {
      uVar6 = uVar7;
    }
    pNVar1 = h->node + uVar6;
    pbVar2 = (byte *)((long)h->node + uVar6 * 0x18 + 8);
    bVar10 = pbVar2[1] & 0x40;
    if ((*pbVar2 & 0xf) == 0) {
      if (bVar10 != 0) {
        (pNVar1->u).key_tt = '\v';
      }
    }
    else {
      if (bVar10 == 0) {
        o = (GCObject *)0x0;
      }
      else {
        o = (pNVar1->u).key_val.gc;
      }
      iVar5 = iscleared(g,o);
      if (iVar5 == 0) {
        if ((((pNVar1->u).tt_ & 0x40) != 0) && (((*(GCObject **)pNVar1)->marked & 0x18) != 0)) {
          reallymarkobject(g,*(GCObject **)pNVar1);
          local_3c = 1;
        }
      }
      else if (((pNVar1->u).tt_ & 0x40) == 0) {
        bVar4 = true;
      }
      else {
        if ((((pNVar1->u).value_.gc)->marked & 0x18) != 0) {
          bVar3 = true;
        }
        bVar4 = true;
      }
    }
  }
  if (g->gcstate == '\0') {
    h->gclist = g->grayagain;
    g->grayagain = (GCObject *)h;
  }
  else if (bVar3) {
    h->gclist = g->ephemeron;
    g->ephemeron = (GCObject *)h;
  }
  else {
    if (!bVar4) {
      genlink(g,(GCObject *)h);
      return local_3c;
    }
    h->gclist = g->allweak;
    g->allweak = (GCObject *)h;
  }
  h->marked = h->marked & 199;
  return local_3c;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h, int inv) {
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  unsigned int i;
  unsigned int nsize = sizenode(h);
  int marked = traversearray(g, h);  /* traverse array part */
  /* traverse hash part; if 'inv', traverse descending
     (see 'convergeephemerons') */
  for (i = 0; i < nsize; i++) {
    Node *n = inv ? gnode(h, nsize - 1 - i) : gnode(h, i);
    if (isempty(gval(n)))  /* entry is empty? */
      clearkey(n);  /* clear its key */
    else if (iscleared(g, gckeyN(n))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  else
    genlink(g, obj2gco(h));  /* check whether collector still needs to see it */
  return marked;
}